

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_2d65b::CleanTestCleanFailure::Run(CleanTestCleanFailure *this)

{
  Test *this_00;
  int iVar1;
  int iVar2;
  undefined1 local_f0 [8];
  Cleaner cleaner;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  CleanTestCleanFailure *pCStack_10;
  int fail_count;
  CleanTestCleanFailure *this_local;
  
  pCStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_CleanTest).super_StateTestWithBuiltinRules.state_,
              "build dir: cat src1\n",local_1c);
  iVar2 = local_14;
  iVar1 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"dir",&local_41);
    VirtualFileSystem::MakeDir(&(this->super_CleanTest).fs_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    Cleaner::Cleaner((Cleaner *)local_f0,
                     &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_,
                     &(this->super_CleanTest).config_,
                     &(this->super_CleanTest).fs_.super_DiskInterface);
    this_00 = g_current_test;
    iVar2 = Cleaner::CleanAll((Cleaner *)local_f0,false);
    testing::Test::Check
              (this_00,iVar2 != 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0x19b,"0 != cleaner.CleanAll()");
    Cleaner::~Cleaner((Cleaner *)local_f0);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanFailure) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
                                      "build dir: cat src1\n"));
  fs_.MakeDir("dir");
  Cleaner cleaner(&state_, config_, &fs_);
  EXPECT_NE(0, cleaner.CleanAll());
}